

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSymm.c
# Opt level: O0

int cuddZddSymmCheck(DdManager *table,int x,int y)

{
  DdHalfWord DVar1;
  bool bVar2;
  bool bVar3;
  int local_74;
  int symm_found;
  int TotalRefCount;
  int arccount;
  int xsymmyp;
  int xsymmy;
  int yindex;
  DdNode *f10;
  DdNode *f11;
  DdNode *f00;
  DdNode *f01;
  DdNode *f1;
  DdNode *f0;
  DdNode *f;
  int i;
  int y_local;
  int x_local;
  DdManager *table_local;
  
  bVar2 = true;
  bVar3 = true;
  symm_found = 0;
  local_74 = 0;
  empty = table->zero;
  DVar1 = table->invpermZ[y];
  f._4_4_ = table->subtableZ[x].slots;
  do {
    f._4_4_ = f._4_4_ - 1;
    if ((int)f._4_4_ < 0) {
      f._4_4_ = table->subtableZ[y].slots;
      while (f._4_4_ = f._4_4_ - 1, -1 < (int)f._4_4_) {
        for (f0 = table->subtableZ[y].nodelist[(int)f._4_4_]; f0 != (DdNode *)0x0; f0 = f0->next) {
          if ((f0->type).kids.E != empty) {
            local_74 = f0->ref + local_74;
          }
        }
      }
      return (uint)(symm_found == local_74);
    }
    for (f0 = table->subtableZ[x].nodelist[(int)f._4_4_]; f0 != (DdNode *)0x0; f0 = f0->next) {
      _xsymmy = (f0->type).kids.T;
      f11 = (f0->type).kids.E;
      if (_xsymmy->index == DVar1) {
        f10 = (_xsymmy->type).kids.T;
        _xsymmy = (_xsymmy->type).kids.E;
        if (_xsymmy != empty) {
          symm_found = symm_found + 1;
        }
      }
      else {
        f10 = empty;
        if (f11->index != DVar1) {
          return 0;
        }
      }
      f00 = empty;
      if (f11->index == DVar1) {
        f00 = (f11->type).kids.T;
        f11 = (f11->type).kids.E;
        if (f11 != empty) {
          symm_found = symm_found + 1;
        }
      }
      if (f00 != _xsymmy) {
        bVar2 = false;
      }
      if (f10 != f11) {
        bVar3 = false;
      }
      if ((!bVar2) && (!bVar3)) {
        return 0;
      }
    }
  } while( true );
}

Assistant:

int
cuddZddSymmCheck(
  DdManager * table,
  int  x,
  int  y)
{
    int         i;
    DdNode      *f, *f0, *f1, *f01, *f00, *f11, *f10;
    int         yindex;
    int         xsymmy = 1;
    int         xsymmyp = 1;
    int         arccount = 0;
    int         TotalRefCount = 0;
    int         symm_found;

    empty = table->zero;

    yindex = table->invpermZ[y];
    for (i = table->subtableZ[x].slots - 1; i >= 0; i--) {
        f = table->subtableZ[x].nodelist[i];
        while (f != NULL) {
            /* Find f1, f0, f11, f10, f01, f00 */
            f1 = cuddT(f);
            f0 = cuddE(f);
            if ((int) f1->index == yindex) {
                f11 = cuddT(f1);
                f10 = cuddE(f1);
                if (f10 != empty)
                    arccount++;
            } else {
                if ((int) f0->index != yindex) {
                    return(0); /* f bypasses layer y */
                }
                f11 = empty;
                f10 = f1;
            }
            if ((int) f0->index == yindex) {
                f01 = cuddT(f0);
                f00 = cuddE(f0);
                if (f00 != empty)
                    arccount++;
            } else {
                f01 = empty;
                f00 = f0;
            }
            if (f01 != f10)
                xsymmy = 0;
            if (f11 != f00)
                xsymmyp = 0;
            if ((xsymmy == 0) && (xsymmyp == 0))
                return(0);

            f = f->next;
        } /* for each element of the collision list */
    } /* for each slot of the subtable */

    /* Calculate the total reference counts of y
    ** whose else arc is not empty.
    */
    for (i = table->subtableZ[y].slots - 1; i >= 0; i--) {
        f = table->subtableZ[y].nodelist[i];
        while (f != NIL(DdNode)) {
            if (cuddE(f) != empty)
                TotalRefCount += f->ref;
            f = f->next;
        }
    }

    symm_found = (arccount == TotalRefCount);
#if defined(DD_DEBUG) && defined(DD_VERBOSE)
    if (symm_found) {
        int xindex = table->invpermZ[x];
        (void) fprintf(table->out,
                       "Found symmetry! x =%d\ty = %d\tPos(%d,%d)\n",
                       xindex,yindex,x,y);
    }
#endif

    return(symm_found);

}